

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

size_t __thiscall
wasm::SExpressionWasmBuilder::parseFunctionNames
          (SExpressionWasmBuilder *this,Element *s,Name *name,Name *exportName)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  Element *pEVar4;
  char *extraout_RDX;
  uint i;
  ulong uVar5;
  string_view *psVar6;
  string_view sVar7;
  IString str;
  
  uVar5 = 1;
  while( true ) {
    sVar3 = Element::size(s);
    i = (uint)uVar5;
    if (((2 < uVar5) || (sVar3 <= uVar5)) ||
       (pEVar4 = Element::operator[](s,i), pEVar4->isList_ != false)) break;
    pEVar4 = Element::operator[](s,i);
    bVar2 = pEVar4->quoted_;
    bVar1 = pEVar4->isList_;
    pEVar4 = Element::operator[](s,i);
    if ((bVar1 != false) || (psVar6 = (string_view *)exportName, (bVar2 & 1U) == 0)) {
      if ((pEVar4->isList_ != false) || ((pEVar4->dollared_ & 1U) == 0)) break;
      pEVar4 = Element::operator[](s,i);
      psVar6 = (string_view *)name;
    }
    sVar7 = (string_view)Element::str(pEVar4);
    *psVar6 = sVar7;
    uVar5 = uVar5 + 1;
  }
  sVar3 = Element::size(s);
  if ((uVar5 < sVar3) && (pEVar4 = Element::operator[](s,i), pEVar4->isList_ == true)) {
    pEVar4 = Element::operator[](s,i);
    str.str._M_str = extraout_RDX;
    str.str._M_len = EXPORT._8_8_;
    bVar2 = elementStartsWith(pEVar4,str);
    if (bVar2) {
      pEVar4 = Element::operator[](pEVar4,1);
      sVar7 = (string_view)Element::str(pEVar4);
      (exportName->super_IString).str = sVar7;
      uVar5 = uVar5 + 1;
    }
  }
  return uVar5;
}

Assistant:

size_t SExpressionWasmBuilder::parseFunctionNames(Element& s,
                                                  Name& name,
                                                  Name& exportName) {
  size_t i = 1;
  while (i < s.size() && i < 3 && s[i]->isStr()) {
    if (s[i]->quoted()) {
      // an export name
      exportName = s[i]->str();
      i++;
    } else if (s[i]->dollared()) {
      name = s[i]->str();
      i++;
    } else {
      break;
    }
  }
  if (i < s.size() && s[i]->isList()) {
    auto& inner = *s[i];
    if (elementStartsWith(inner, EXPORT)) {
      exportName = inner[1]->str();
      i++;
    }
  }
#if 0
  if (exportName.is() && !name.is()) {
    name = exportName; // useful for debugging
  }
#endif
  return i;
}